

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * __thiscall
Util::toString_abi_cxx11_(string *__return_storage_ptr__,Util *this,ImageScaleType scaleType)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "ScaleCenter";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "ScaleStretch";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "ScaleAspectInside";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "ScaleAspectOutside";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "ScaleNinePatch";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "UNSUPPORTED";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Util::toString(ImageScaleType scaleType)
{
	switch (scaleType)
	{
	case ScaleAspectInside:
		return "ScaleAspectInside";
	case ScaleCenter:
		return "ScaleCenter";
	case ScaleAspectOutside:
		return "ScaleAspectOutside";
	case ScaleNinePatch:
		return "ScaleNinePatch";
	case ScaleStretch:
		return "ScaleStretch";
	default:
		return "UNSUPPORTED";
	}
}